

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 06.cpp
# Opt level: O1

int main(void)

{
  size_t sVar1;
  long *plVar2;
  int iVar3;
  char eme [8];
  char local_38 [8];
  
  setlocale(6,anon_var_dwarf_91a + 0x43);
  builtin_strncpy(local_38,"\x1b[1;34m",8);
  sVar1 = strlen(local_38);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_38,sVar1);
  iVar3 = 0;
  do {
    plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Friedrich Nietzsche",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_8ee,0x1e);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_904,0x52);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_91a,0x43);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    iVar3 = iVar3 + 1;
  } while (iVar3 != 7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Ate entao temos um \'tu deves\'.",0x1e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Precisamos de uma moral que nos entregue um \'tu sentes?\'",0x38
            );
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  return 0;
}

Assistant:

int main()
{
  setlocale(LC_ALL, "");

  char eme[] = {0x1b, '[', '1', ';', '3', '4', 'm', 0};
  cout << eme;

  int i = 6;
  const char n = 'n';

  for (i = 0; i <= 6; i++)
  {
    if (n)
    {
      cout << i << endl;
    }
    cout << "Friedrich Nietzsche" << endl;
    cout << "O medo é o pai da moralidade." << endl;
    cout << "Aquele que abandonou a Deus prende-se em redobrada severidade à crença na moral." << endl;
    cout << "Através da moral conduz-se a humanidade mais facilmente pelo bico!" << endl;
  }
  cout << "Ate entao temos um 'tu deves'." << endl;
  cout << "Precisamos de uma moral que nos entregue um 'tu sentes?'" << endl;
  cout << endl;

  return 0;
}